

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O1

int __thiscall
CVmObject::getp_get_prop_params
          (CVmObject *this,vm_obj_id_t self,vm_val_t *retval,uint *argc,vm_prop_id_t param_4,
          vm_obj_id_t *param_5)

{
  vm_val_t *pvVar1;
  int iVar2;
  vm_obj_id_t vVar3;
  CVmObjList *this_00;
  int varargs;
  int opt_args;
  int min_args;
  vm_val_t val;
  int local_54;
  int local_50;
  int local_4c;
  vm_val_t local_48;
  
  if (getp_get_prop_params(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)::desc
      == '\0') {
    getp_get_prop_params();
  }
  iVar2 = get_prop_check_argc(retval,argc,&getp_get_prop_params::desc);
  pvVar1 = sp_;
  if (iVar2 == 0) {
    local_48.typ = sp_[-1].typ;
    local_48._4_4_ = *(undefined4 *)&sp_[-1].field_0x4;
    local_48.val = sp_[-1].val;
    if (local_48.typ != VM_PROP) {
      sp_ = sp_ + -1;
      err_throw(0x7db);
    }
    sp_[-1].typ = VM_OBJ;
    pvVar1[-1].val.obj = self;
    get_prop_interface(this,self,local_48.val.prop,&local_4c,&local_50,&local_54);
    vVar3 = CVmObjList::create(0,3);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar3;
    this_00 = (CVmObjList *)
              ((long)&G_obj_table_X.pages_[vVar3 >> 0xc]->ptr_ + (ulong)((vVar3 & 0xfff) * 0x18));
    local_48.typ = VM_INT;
    CVmObjList::cons_set_element(this_00,0,&local_48);
    local_48.typ = VM_INT;
    local_48.val.obj = local_50;
    CVmObjList::cons_set_element(this_00,1,&local_48);
    local_48.typ = VM_TRUE - (local_54 == 0);
    CVmObjList::cons_set_element(this_00,2,&local_48);
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObject::getp_get_prop_params(VMG_ vm_obj_id_t self,
                                    vm_val_t *retval, uint *argc,
                                    vm_prop_id_t, vm_obj_id_t *)
{
    vm_val_t val;
    vm_prop_id_t prop;
    int min_args, opt_args, varargs;
    static CVmNativeCodeDesc desc(1);
    CVmObjList *lst;

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* pop the property address to test */
    G_interpreter->pop_prop(vmg_ &val);
    prop = val.val.prop;

    /* push a self-reference while we're working */
    G_stk->push()->set_obj(self);

    /* get the property information */
    get_prop_interface(vmg_ self, prop, min_args, opt_args, varargs);

    /* 
     *   Allocate our return list.  We need three elements: [minArgs,
     *   optionalArgs, isVarargs]. 
     */
    retval->set_obj(CVmObjList::create(vmg_ FALSE, 3));

    /* get the list object, properly cast */
    lst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);

    /* set the minimum argument count */
    val.set_int(min_args);
    lst->cons_set_element(0, &val);

    /* set the optional argument count */
    val.set_int(opt_args);
    lst->cons_set_element(1, &val);

    /* set the varargs flag */
    val.set_logical(varargs);
    lst->cons_set_element(2, &val);

    /* discard our self-reference */
    G_stk->discard();

    /* handled */
    return TRUE;
}